

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> __thiscall
spvtools::opt::InlinePass::InlineBasicBlocks
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,DebugInlinedAtContext *inlined_at_ctx,Function *calleeFn)

{
  bool *pbVar1;
  BasicBlock *pBVar2;
  long lVar3;
  IRContext *this_00;
  bool bVar4;
  uint32_t uVar5;
  NonSemanticShaderDebugInfo100Instructions NVar6;
  pointer __p;
  const_iterator cVar7;
  Instruction *pIVar8;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var9;
  long *plVar10;
  long in_stack_00000008;
  BasicBlock *local_68;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_60;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_58;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
  *local_50;
  long *local_48;
  Function *local_40;
  Instruction *local_38;
  
  plVar10 = (long *)(*(long *)(in_stack_00000008 + 0x98) + 8);
  local_60._M_head_impl = (BasicBlock *)this;
  local_58 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)new_blk_ptr;
  local_50 = (vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
              *)callee2caller;
  local_40 = calleeFn;
  if (plVar10 != *(long **)(in_stack_00000008 + 0xa0)) {
    do {
      std::
      vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
                (local_50,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           *)inlined_at_ctx);
      pIVar8 = *(Instruction **)(*plVar10 + 8);
      uVar5 = 0;
      if (pIVar8->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
      }
      local_68 = (BasicBlock *)CONCAT44(local_68._4_4_,uVar5);
      cVar7 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_58,(key_type_conflict *)&local_68);
      _Var9._M_head_impl = local_60._M_head_impl;
      if (cVar7.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          == (__node_type *)0x0) goto LAB_0021e6b5;
      NewLabel((InlinePass *)&stack0xffffffffffffffc8,(uint32_t)new_blocks);
      pIVar8 = (Instruction *)operator_new(0x88);
      (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
           (_func_int **)0x0;
      (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = local_38;
      pbVar1 = &(pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_;
      *(undefined ***)&(pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ =
           &PTR__Instruction_003d7c30;
      *(undefined4 *)
       &(pIVar8->operands_).
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 0;
      *(undefined8 *)
       ((long)&(pIVar8->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start + 6) = 0;
      (pIVar8->operands_).
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pIVar8[1].super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ =
           (Instruction *)0x0;
      pIVar8[1].super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)0x0;
      pIVar8[1].super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
      (pIVar8->dbg_line_insts_).
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pIVar8->dbg_scope_).lexical_scope_ = 0;
      (pIVar8->dbg_scope_).inlined_at_ = 0;
      (pIVar8->dbg_line_insts_).
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar8->dbg_line_insts_).
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pIVar8->context_ = (IRContext *)pbVar1;
      *(bool **)&pIVar8->opcode_ = pbVar1;
      *(undefined1 *)&pIVar8->unique_id_ = 1;
      (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)&PTR__InstructionList_003d7cc8;
      local_68 = (BasicBlock *)0x0;
      pBVar2 = (BasicBlock *)inlined_at_ctx->call_inst_line_;
      inlined_at_ctx->call_inst_line_ = pIVar8;
      if ((pBVar2 != (BasicBlock *)0x0) &&
         (std::default_delete<spvtools::opt::BasicBlock>::operator()
                    ((default_delete<spvtools::opt::BasicBlock> *)inlined_at_ctx,pBVar2),
         local_68 != (BasicBlock *)0x0)) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)&local_68,local_68);
      }
      lVar3 = *plVar10;
      local_48 = plVar10;
      for (pIVar8 = *(Instruction **)(lVar3 + 0x20); pIVar8 != (Instruction *)(lVar3 + 0x18);
          pIVar8 = (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        NVar6 = Instruction::GetShader100DebugOpcode(pIVar8);
        if (NVar6 != NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
          pBVar2 = (BasicBlock *)inlined_at_ctx->call_inst_line_;
          this_00 = (IRContext *)
                    new_blocks[1].
                    super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((this_00->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
            IRContext::BuildDebugInfoManager(this_00);
          }
          uVar5 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                            ((this_00->debug_info_mgr_)._M_t.
                             super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                             .
                             super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>
                             ._M_head_impl,(pIVar8->dbg_scope_).inlined_at_,
                             (DebugInlinedAtContext *)local_40);
          bVar4 = InlineSingleInstruction
                            ((InlinePass *)new_blocks,
                             (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)local_58,pBVar2,pIVar8,uVar5);
          _Var9._M_head_impl = local_60._M_head_impl;
          if (!bVar4) goto LAB_0021e6b5;
        }
      }
      plVar10 = local_48 + 1;
    } while (plVar10 != *(long **)(in_stack_00000008 + 0xa0));
  }
  *(Instruction **)local_60._M_head_impl = inlined_at_ctx->call_inst_line_;
  _Var9._M_head_impl = (BasicBlock *)inlined_at_ctx;
LAB_0021e6b5:
  (_Var9._M_head_impl)->function_ = (Function *)0x0;
  return (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>)
         local_60._M_head_impl;
}

Assistant:

std::unique_ptr<BasicBlock> InlinePass::InlineBasicBlocks(
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    std::unique_ptr<BasicBlock> new_blk_ptr,
    analysis::DebugInlinedAtContext* inlined_at_ctx, Function* calleeFn) {
  auto callee_block_itr = calleeFn->begin();
  ++callee_block_itr;

  while (callee_block_itr != calleeFn->end()) {
    new_blocks->push_back(std::move(new_blk_ptr));
    const auto mapItr =
        callee2caller.find(callee_block_itr->GetLabelInst()->result_id());
    if (mapItr == callee2caller.end()) return nullptr;
    new_blk_ptr = MakeUnique<BasicBlock>(NewLabel(mapItr->second));

    auto tail_inst_itr = callee_block_itr->end();
    for (auto inst_itr = callee_block_itr->begin(); inst_itr != tail_inst_itr;
         ++inst_itr) {
      // Don't inline function definition links, the calling function is not a
      // definition
      if (inst_itr->GetShader100DebugOpcode() ==
          NonSemanticShaderDebugInfo100DebugFunctionDefinition)
        continue;
      if (!InlineSingleInstruction(
              callee2caller, new_blk_ptr.get(), &*inst_itr,
              context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
                  inst_itr->GetDebugScope().GetInlinedAt(), inlined_at_ctx))) {
        return nullptr;
      }
    }

    ++callee_block_itr;
  }
  return new_blk_ptr;
}